

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QFlags<QLayoutPolicy::PolicyFlag>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  undefined4 *in_RDX;
  QDebug *in_RSI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe0;
  QDebug local_18;
  QDebug local_10;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  operator<<<QFlags<QLayoutPolicy::PolicyFlag>,_true>
            ((QDebug *)CONCAT44(*in_RDX,in_stack_ffffffffffffffe0),
             (QFlagsStorageHelper<QLayoutPolicy::PolicyFlag,_4>)SUB84((ulong)lVar1 >> 0x20,0));
  QDebug::~QDebug(&local_10);
  QDebug::~QDebug(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }